

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MPSegment.hpp
# Opt level: O3

bool __thiscall
CppJieba::MPSegment::cut
          (MPSegment *this,const_iterator begin,const_iterator end,
          vector<CppJieba::TrieNodeInfo,_std::allocator<CppJieba::TrieNodeInfo>_> *segWordInfos)

{
  bool bVar1;
  bool bVar2;
  SegmentContext segContext;
  string local_48;
  SegmentContext local_28;
  
  if ((this->super_SegmentBase)._isInited == false) {
    __assert_fail("_getInitFlag()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/MPSegment.hpp"
                  ,0x74,
                  "bool CppJieba::MPSegment::cut(Unicode::const_iterator, Unicode::const_iterator, vector<TrieNodeInfo> &) const"
                 );
  }
  local_28.super__Vector_base<CppJieba::SegmentChar,_std::allocator<CppJieba::SegmentChar>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  local_28.super__Vector_base<CppJieba::SegmentChar,_std::allocator<CppJieba::SegmentChar>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28.super__Vector_base<CppJieba::SegmentChar,_std::allocator<CppJieba::SegmentChar>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar1 = _calcDAG(this,begin,end,&local_28);
  if (bVar1) {
    bVar1 = _calcDP(this,&local_28);
    if (bVar1) {
      bVar1 = _cut(this,&local_28,segWordInfos);
      bVar2 = true;
      if (bVar1) goto LAB_00110ada;
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"_cut failed.","");
      Limonp::Logger::LoggingF(3,"MPSegment.hpp",0x86,&local_48);
    }
    else {
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"_calcDP failed.","");
      Limonp::Logger::LoggingF(3,"MPSegment.hpp",0x80,&local_48);
    }
  }
  else {
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"_calcDAG failed.","");
    Limonp::Logger::LoggingF(3,"MPSegment.hpp",0x7a,&local_48);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  bVar2 = false;
LAB_00110ada:
  std::vector<CppJieba::SegmentChar,_std::allocator<CppJieba::SegmentChar>_>::~vector(&local_28);
  return bVar2;
}

Assistant:

bool cut(Unicode::const_iterator begin , Unicode::const_iterator end, vector<TrieNodeInfo>& segWordInfos)const
            {
				assert(_getInitFlag());
                SegmentContext segContext;

                //calc DAG
                if(!_calcDAG(begin, end, segContext))
                {
                    LogError("_calcDAG failed.");
                    return false;
                }

                if(!_calcDP(segContext))
                {
                    LogError("_calcDP failed.");
                    return false;
                }

                if(!_cut(segContext, segWordInfos))
                {
                    LogError("_cut failed.");
                    return false;
                }

                return true;
            }